

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O1

void Js::AsmJsByteCodeDumper::
     DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ByteCodeDumper::DumpReg(data->R0);
  ByteCodeDumper::DumpReg(data->R1);
  ByteCodeDumper::DumpReg(data->R2);
  ByteCodeDumper::DumpReg(data->R3);
  ByteCodeDumper::DumpReg(data->R4);
  ByteCodeDumper::DumpReg(data->R5);
  ByteCodeDumper::DumpReg(data->R6);
  ByteCodeDumper::DumpReg(data->R7);
  ByteCodeDumper::DumpReg(data->R8);
  ByteCodeDumper::DumpReg(data->R9);
  ByteCodeDumper::DumpReg(data->R10);
  ByteCodeDumper::DumpReg(data->R11);
  ByteCodeDumper::DumpReg(data->R12);
  ByteCodeDumper::DumpReg(data->R13);
  ByteCodeDumper::DumpReg(data->R14);
  ByteCodeDumper::DumpReg(data->R15);
  ByteCodeDumper::DumpReg(data->R16);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmReg17(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpReg(data->R0);
        DumpReg(data->R1);
        DumpReg(data->R2);
        DumpReg(data->R3);
        DumpReg(data->R4);
        DumpReg(data->R5);
        DumpReg(data->R6);
        DumpReg(data->R7);
        DumpReg(data->R8);
        DumpReg(data->R9);
        DumpReg(data->R10);
        DumpReg(data->R11);
        DumpReg(data->R12);
        DumpReg(data->R13);
        DumpReg(data->R14);
        DumpReg(data->R15);
        DumpReg(data->R16);
    }